

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O2

void Ssw_ManSweepTransfer(Ssw_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  Aig_Obj_t *pObj;
  uint __line;
  int i;
  Aig_Obj_t *pObj_00;
  uint *puVar2;
  int i_00;
  char *__assertion;
  
  i_00 = 0;
  do {
    pVVar1 = p->pAig->vCis;
    if (pVVar1->nSize <= i_00) {
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,i_00);
    pObj = p->pNodeToFrames[(long)pObj_00->Id * (long)p->nFrames];
    if (pObj == (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1)) {
      Ssw_SmlObjAssignConst(p->pSml,pObj_00,0,0);
    }
    else {
      if (((ulong)pObj & 1) != 0) {
        __assertion = "!Aig_IsComplement(pObjFraig)";
        __line = 0x3c;
LAB_005678bd:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswLcorr.c"
                      ,__line,"void Ssw_ManSweepTransfer(Ssw_Man_t *)");
      }
      if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
        __assertion = "Aig_ObjIsCi(pObjFraig)";
        __line = 0x3d;
        goto LAB_005678bd;
      }
      pVVar1 = p->vSimInfo;
      i = Aig_ObjCioId(pObj);
      puVar2 = (uint *)Vec_PtrEntry(pVVar1,i);
      Ssw_SmlObjSetWord(p->pSml,pObj_00,*puVar2,0,0);
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Tranfers simulation information from FRAIG to AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManSweepTransfer( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFraig;
    unsigned * pInfo;
    int i;
    // transfer simulation information
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pObjFraig = Ssw_ObjFrame( p, pObj, 0 );
        if ( pObjFraig == Aig_ManConst0(p->pFrames) )
        {
            Ssw_SmlObjAssignConst( p->pSml, pObj, 0, 0 );
            continue;
        }
        assert( !Aig_IsComplement(pObjFraig) );
        assert( Aig_ObjIsCi(pObjFraig) );
        pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
        Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, 0 );
    }
}